

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validate.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  Enum EVar2;
  char *pcVar3;
  pointer log_stream;
  uchar *data;
  size_type size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename;
  string local_440;
  Enum local_420;
  undefined1 local_41c [8];
  ValidateOptions options_1;
  undefined1 local_408 [8];
  ReadBinaryOptions options;
  undefined1 local_3e0 [7];
  bool kStopOnFirstError;
  Module module;
  Errors errors;
  string_view local_50;
  Enum local_3c;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Result result;
  char **argv_local;
  int argc_local;
  
  wabt::Result::Result
            ((Result *)
             ((long)&file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  wabt::string_view::string_view(&local_50,pcVar3);
  filename.size_ = (size_type)local_38;
  filename.data_ = (char *)local_50.size_;
  local_3c = (Enum)wabt::ReadFile((wabt *)local_50.data_,filename,in_RCX);
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_3c;
  bVar1 = wabt::Succeeded((Result)local_3c);
  if (bVar1) {
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
    wabt::Module::Module((Module *)local_3e0);
    options._31_1_ = 1;
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)local_408,&s_features,&log_stream->super_Stream,
               (bool)(s_read_debug_names & 1),true,(bool)(s_fail_on_custom_section_error & 1));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    options_1.features._4_4_ =
         wabt::ReadBinaryIr(pcVar3,data,size,(ReadBinaryOptions *)local_408,
                            (Errors *)
                            &module.elem_segment_bindings.
                             super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                             ._M_h._M_single_bucket,(Module *)local_3e0);
    options_1.features._8_4_ = options_1.features._4_4_;
    file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)options_1.features._4_4_;
    bVar1 = wabt::Succeeded((Result)options_1.features._4_4_);
    if (bVar1) {
      wabt::ValidateOptions::ValidateOptions((ValidateOptions *)local_41c,&s_features);
      local_420 = (Enum)wabt::ValidateModule
                                  ((Module *)local_3e0,
                                   (Errors *)
                                   &module.elem_segment_bindings.
                                    super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                                    ._M_h._M_single_bucket,(ValidateOptions *)local_41c);
      file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (Result)local_420;
    }
    file = _stderr;
    std::__cxx11::string::string((string *)&local_440);
    wabt::FormatErrorsToFile
              ((Errors *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket,Binary,(LexerSourceLineFinder *)0x0,file,&local_440,Never,
               0x50);
    std::__cxx11::string::~string((string *)&local_440);
    wabt::Module::~Module((Module *)local_3e0);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.elem_segment_bindings.
                super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                ._M_h._M_single_bucket);
  }
  EVar2 = wabt::Result::operator_cast_to_Enum
                    ((Result *)
                     ((long)&file_data.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              s_fail_on_custom_section_error);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      ValidateOptions options(s_features);
      result = ValidateModule(&module, &errors, options);
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}